

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::GetNode
          (TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit> *this,FModelVertex key)

{
  Node *pNVar1;
  
  pNVar1 = FindKey(this,key);
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = NewKey(this,key);
    (pNVar1->Pair).Value = 0xffffffff;
  }
  return pNVar1;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}